

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

int ws_make_accept(char *key,char *accept)

{
  int iVar1;
  size_t sVar2;
  undefined1 local_a0 [8];
  nni_sha1_ctx ctx;
  uint8_t digest [20];
  
  sVar2 = strlen(key);
  if (sVar2 == 0x18) {
    nni_sha1_init((nni_sha1_ctx *)local_a0);
    nni_sha1_update((nni_sha1_ctx *)local_a0,key,0x18);
    nni_sha1_update((nni_sha1_ctx *)local_a0,"258EAFA5-E914-47DA-95CA-C5AB0DC85B11",0x24);
    nni_sha1_final((nni_sha1_ctx *)local_a0,(uint8_t *)&ctx.idx);
    nni_base64_encode((uint8_t *)&ctx.idx,0x14,accept,0x1c);
    accept[0x1c] = '\0';
    iVar1 = 0;
  }
  else {
    iVar1 = 3;
  }
  return iVar1;
}

Assistant:

static int
ws_make_accept(const char *key, char *accept)
{
	uint8_t      digest[20];
	nni_sha1_ctx ctx;

#define WS_KEY_GUID "258EAFA5-E914-47DA-95CA-C5AB0DC85B11"
#define WS_KEY_GUIDLEN 36

	if (strlen(key) != 24) {
		return (NNG_EINVAL);
	}

	nni_sha1_init(&ctx);
	nni_sha1_update(&ctx, key, 24);
	nni_sha1_update(&ctx, WS_KEY_GUID, WS_KEY_GUIDLEN);
	nni_sha1_final(&ctx, digest);

	nni_base64_encode(digest, 20, accept, 28);
	accept[28] = '\0';
	return (0);
}